

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

pair<_66e59461_> __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::DiagCode,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,slang::DiagCode,slang::Hasher<slang::DiagCode>,ska::detailv3::KeyOrValueHasher<slang::DiagCode,std::pair<slang::DiagCode,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,slang::Hasher<slang::DiagCode>>,std::equal_to<slang::DiagCode>,ska::detailv3::KeyOrValueEqu...agnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>>
::
emplace<slang::DiagCode_const&,ska::flat_hash_map<slang::DiagCode,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>,slang::Hasher<slang::DiagCode>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>::convertible_to_value>
          (sherwood_v3_table<std::pair<slang::DiagCode,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,slang::DiagCode,slang::Hasher<slang::DiagCode>,ska::detailv3::KeyOrValueHasher<slang::DiagCode,std::pair<slang::DiagCode,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,slang::Hasher<slang::DiagCode>>,std::equal_to<slang::DiagCode>,ska::detailv3::KeyOrValueEqu___agnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>>
           *this,DiagCode *key,convertible_to_value *args)

{
  bool bVar1;
  size_t hash;
  undefined8 extraout_RDX;
  pair<_66e59461_> pVar2;
  pair<_66e59461_> pVar3;
  bool local_51;
  templated_iterator<std::pair<slang::DiagCode,_ska::flat_hash_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::Hasher<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>
  local_50;
  char local_41;
  EntryPointer psStack_40;
  int8_t distance_from_desired;
  EntryPointer current_entry;
  size_t index;
  convertible_to_value *args_local;
  DiagCode *key_local;
  sherwood_v3_table<_ed070bb7_> *this_local;
  bool local_10;
  
  index = (size_t)args;
  args_local = (convertible_to_value *)key;
  key_local = (DiagCode *)this;
  hash = sherwood_v3_table<$ed070bb7$>::hash_object<slang::DiagCode>
                   ((sherwood_v3_table<_ed070bb7_> *)this,key);
  current_entry =
       (EntryPointer)
       fibonacci_hash_policy::index_for_hash
                 ((fibonacci_hash_policy *)(this + 0x10),hash,*(size_t *)(this + 8));
  psStack_40 = (EntryPointer)(*(long *)this + (long)current_entry * 0x30);
  local_41 = '\0';
  do {
    if (psStack_40->distance_from_desired < local_41) {
      pVar2 = emplace_new_key<slang::DiagCode_const&,ska::flat_hash_map<slang::DiagCode,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>,slang::Hasher<slang::DiagCode>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>::convertible_to_value>
                        (this,local_41,psStack_40,(DiagCode *)args_local,
                         (convertible_to_value *)index);
      local_10 = pVar2.second;
LAB_001aa586:
      this_local = (sherwood_v3_table<_ed070bb7_> *)pVar2.first.current;
      pVar3._9_7_ = pVar2._9_7_;
      pVar3.second = local_10;
      pVar3.first.current = (EntryPointer)this_local;
      return pVar3;
    }
    bVar1 = compares_equal<slang::DiagCode,std::pair<slang::DiagCode,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>
                      (this,(DiagCode *)args_local,&(psStack_40->field_1).value);
    if (bVar1) {
      sherwood_v3_table<$ed070bb7$>::
      templated_iterator<std::pair<slang::DiagCode,_ska::flat_hash_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::Hasher<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>
      ::templated_iterator(&local_50,psStack_40);
      local_51 = false;
      std::pair<$66e59461$>::pair<bool,_true>((pair<_66e59461_> *)&this_local,&local_50,&local_51);
      pVar2._8_8_ = extraout_RDX;
      pVar2.first.current = (EntryPointer)this_local;
      goto LAB_001aa586;
    }
    psStack_40 = psStack_40 + 1;
    local_41 = local_41 + '\x01';
  } while( true );
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }